

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

LayerNormalizationLayerParams * __thiscall
CoreML::Specification::LayerNormalizationLayerParams::New
          (LayerNormalizationLayerParams *this,Arena *arena)

{
  LayerNormalizationLayerParams *this_00;
  
  this_00 = (LayerNormalizationLayerParams *)operator_new(0x40);
  LayerNormalizationLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::LayerNormalizationLayerParams>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

LayerNormalizationLayerParams* LayerNormalizationLayerParams::New(::google::protobuf::Arena* arena) const {
  LayerNormalizationLayerParams* n = new LayerNormalizationLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}